

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O3

RunElement * __thiscall
duckdb::
MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
::ReplayGames(RunElement *__return_storage_ptr__,
             MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
             *this,Games *losers,idx_t slot_idx,RunElement *insert_val)

{
  pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *ppVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long uVar6;
  ulong uVar7;
  unsigned_long uVar8;
  
  uVar6 = (insert_val->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
          super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (insert_val->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
       super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
       _M_head_impl;
  (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar6;
  uVar5 = insert_val->second;
  __return_storage_ptr__->second = uVar5;
  uVar6 = (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
          super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
          _M_head_impl;
  uVar8 = (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
          super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  uVar7 = slot_idx + 0x1e;
  do {
    ppVar1 = losers->_M_elems + (uVar7 >> 1);
    uVar2 = (ppVar1->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
            super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    if (uVar2 < uVar8) {
      uVar4 = (ppVar1->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
              super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
              _M_head_impl;
LAB_00cd9112:
      (ppVar1->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar8;
      (ppVar1->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = uVar6;
      uVar6 = ppVar1->second;
      ppVar1->second = uVar5;
      uVar5 = uVar6;
      uVar6 = uVar4;
      uVar8 = uVar2;
    }
    else if ((uVar2 <= uVar8) &&
            ((uVar4 = (ppVar1->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                      super__Tuple_impl<1UL,_unsigned_long>.
                      super__Head_base<1UL,_unsigned_long,_false>._M_head_impl, uVar4 < uVar6 ||
             ((uVar4 <= uVar6 && (ppVar1->second < uVar5)))))) goto LAB_00cd9112;
    bVar3 = uVar7 < 2;
    uVar7 = (uVar7 >> 1) - 1;
    if (bVar3) {
      __return_storage_ptr__->second = uVar5;
      (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar8;
      (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = uVar6;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

RunElement ReplayGames(Games &losers, idx_t slot_idx, const RunElement &insert_val) {
		RunElement smallest = insert_val;
		//	Start at a fake level below
		auto idx = slot_idx + losers.size();
		do {
			// Parent index
			idx = (idx - 1) / 2;
			// swap if out of order
			if (cmp(losers[idx], smallest)) {
				std::swap(losers[idx], smallest);
			}
		} while (idx);

		return smallest;
	}